

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::DataManReader::RequestThread(DataManReader *this)

{
  DataManSerializer *this_00;
  DataManMonitor *this_01;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  pointer puVar4;
  reference j;
  size_t step;
  unsigned_long *timeStamp;
  _Rb_tree_header *p_Var5;
  size_t step_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  jmsg;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> buffer;
  string request;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  __atomic_base<long> local_98;
  VecPtr local_90;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  char *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  this_00 = &this->m_Serializer;
  this_01 = &this->m_Monitor;
  do {
    local_80[0] = local_70;
    if (((this->m_RequesterThreadActive)._M_base._M_i & 1U) == 0) {
      return;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Step","");
    zmq::ZmqReqRep::Request((ZmqReqRep *)&local_a8,(char *)&this->m_Requester,(size_t)local_80[0]);
    bVar3 = true;
    if (local_a8 != (element_type *)0x0) {
      pcVar1 = (local_a8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = (local_a8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar2 != pcVar1) {
        if ((ulong)((long)pcVar2 - (long)pcVar1) < 0x40) {
          local_58._M_unused._M_object = (void *)0x0;
          local_58._8_8_ = 0;
          local_48 = (code *)0x0;
          uStack_40 = 0;
          local_60 = pcVar1;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::parse<char*>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_c0,&local_60,(parser_callback_t *)&local_58,true,false);
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          j = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_c0,"FinalStep");
          local_98._M_i = 0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                    (j,&local_98._M_i);
          LOCK();
          (this->m_FinalStep).super___atomic_base<long>._M_i = local_98._M_i;
          UNLOCK();
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_c0);
          bVar3 = false;
        }
        else {
          local_90.
          super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_a8;
          local_90.
          super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_a0;
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_a0->_M_use_count = local_a0->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_a0->_M_use_count = local_a0->_M_use_count + 1;
            }
          }
          adios2::format::DataManSerializer::PutPack(this_00,&local_90,this->m_Threading);
          if (local_90.
              super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.
                       super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (this->m_MonitorActive == true) {
            step = adios2::format::DataManSerializer::GetCombiningSteps(this_00);
            DataManMonitor::SetCombiningSteps(this_01,step);
            step_00 = step * 2;
            if (step < 0x14) {
              step_00 = 0x28;
            }
            DataManMonitor::SetAverageSteps(this_01,step_00);
            adios2::format::DataManSerializer::GetTimeStamps(&local_c0,this_00);
            puVar4 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (p_Var5 = (_Rb_tree_header *)
                          local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                p_Var5 != (_Rb_tree_header *)puVar4;
                p_Var5 = &(((_Rep_type *)&p_Var5->_M_header)->_M_impl).super__Rb_tree_header) {
              DataManMonitor::AddLatencyMilliseconds
                        (this_01,*(uint64_t *)&((_Rep_type *)&p_Var5->_M_header)->_M_impl);
            }
            if ((_Rb_tree_header *)
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (_Rb_tree_header *)0x0) {
              operator_delete(local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
  } while (bVar3);
  return;
}

Assistant:

void DataManReader::RequestThread()
{
    while (m_RequesterThreadActive)
    {
        std::string request = "Step";
        auto buffer = m_Requester.Request(request.data(), request.size());
        if (buffer != nullptr && buffer->size() > 0)
        {
            if (buffer->size() < 64)
            {
                try
                {
                    auto jmsg = nlohmann::json::parse(buffer->data());
                    m_FinalStep = jmsg["FinalStep"].get<int64_t>();
                    return;
                }
                catch (...)
                {
                }
            }
            m_Serializer.PutPack(buffer, m_Threading);
            if (m_MonitorActive)
            {
                size_t combiningSteps = m_Serializer.GetCombiningSteps();
                m_Monitor.SetCombiningSteps(combiningSteps);
                if (combiningSteps < 20)
                {
                    m_Monitor.SetAverageSteps(40);
                }
                else
                {
                    m_Monitor.SetAverageSteps(combiningSteps * 2);
                }
                auto timeStamps = m_Serializer.GetTimeStamps();
                for (const auto &timeStamp : timeStamps)
                {
                    m_Monitor.AddLatencyMilliseconds(timeStamp);
                }
            }
        }
    }
}